

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode
RunScriptCore(char *script,JsSourceContext sourceContext,char *sourceUrl,bool parseOnly,
             JsParseScriptAttributes parseAttributes,bool isSourceModule,JsValueRef *result)

{
  LPWSTR sourceUrl_00;
  JsErrorCode JVar1;
  size_t sVar2;
  undefined4 in_register_00000084;
  LPWSTR local_68;
  NarrowToWide url;
  
  url._28_4_ = in_register_00000084;
  url._24_4_ = parseAttributes;
  local_68 = (WCHAR *)0x0;
  sVar2 = strnlen(sourceUrl,0x7fffffff);
  utf8::NarrowStringToWide<void*(*)(unsigned_long)>
            (utf8::malloc_allocator::allocate,sourceUrl,sVar2,&local_68,(charcount_t *)&url,
             (size_t *)&url.dstCount);
  sourceUrl_00 = local_68;
  url.allocateCount._0_1_ = '\x01';
  if (local_68 == (WCHAR *)0x0) {
    JVar1 = JsErrorOutOfMemory;
  }
  else {
    sVar2 = strlen(script);
    JVar1 = RunScriptCore((JsValueRef)0x0,(byte *)script,sVar2,LoadScriptFlag_Utf8Source,
                          sourceContext,sourceUrl_00,parseOnly,url._24_4_,isSourceModule,result);
    if ((local_68 != (WCHAR *)0x0) && ((char)url.allocateCount == '\x01')) {
      free(local_68);
    }
  }
  return JVar1;
}

Assistant:

JsErrorCode RunScriptCore(const char *script, JsSourceContext sourceContext,
    const char *sourceUrl, bool parseOnly, JsParseScriptAttributes parseAttributes,
    bool isSourceModule, JsValueRef *result)
{
    utf8::NarrowToWide url((LPCSTR)sourceUrl);
    if (!url)
    {
        return JsErrorOutOfMemory;
    }

    return RunScriptCore(nullptr, reinterpret_cast<const byte*>(script), strlen(script),
        LoadScriptFlag_Utf8Source, sourceContext, url, parseOnly, parseAttributes,
        isSourceModule, result);
}